

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TesterThread::ShrinkHeap(TesterThread *this)

{
  bool bVar1;
  TesterThread *this_local;
  
  while( true ) {
    if (this->heap_size_ < 0x400001) {
      return;
    }
    bVar1 = std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::empty
                      (&this->heap_);
    if (bVar1) break;
    FreeObject(this);
  }
  syscall(1,2,"Check failed: !heap_.empty()\n",0x1d);
  abort();
}

Assistant:

void ShrinkHeap() {
    while (heap_size_ > FLAGS_threadmb << 20) {
      CHECK(!heap_.empty());
      FreeObject();
    }
  }